

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::Print<char_const(&)[131]>(ostream *ost,char (*args) [131])

{
  bool f;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  char (*local_28) [131];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  ostream *local_8;
  
  local_20 = &local_2b;
  local_2b = 0;
  local_18 = &local_2a;
  local_10 = &local_29;
  local_28 = args;
  local_8 = ost;
  detail::
  Apply_impl<adapt::cuf::detail::PrintToStream,std::tuple<std::ostream&,adapt::cuf::detail::print::Delimiter<32>const&,adapt::cuf::detail::print::End<10>const&,bool_const&,char_const(&)[131]>,0ul,1ul,2ul,3ul,4ul>
            (&local_2c,&local_28);
  return;
}

Assistant:

void Print(std::ostream& ost, Args&& ...args)
{
	constexpr auto t = detail::GetOptions<std::decay_t<Args>...>();
	constexpr auto d = std::get<0>(t);
	constexpr auto e = std::get<1>(t);
	constexpr auto f = std::get<2>(t).value;
	constexpr auto n = std::get<3>(t).value;
	Apply(detail::PrintToStream(), std::tuple_cat(std::forward_as_tuple(ost, d, e, f), GetFrontArgs<n>(std::forward<Args>(args)...)));
}